

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

ostream * ast::operator<<(ostream *out,Expr *obj)

{
  string local_38 [32];
  Expr *local_18;
  Expr *obj_local;
  ostream *out_local;
  
  local_18 = obj;
  obj_local = (Expr *)out;
  (*(obj->super_Node)._vptr_Node[3])();
  std::operator<<(out,local_38);
  std::__cxx11::string::~string(local_38);
  return (ostream *)obj_local;
}

Assistant:

std::ostream& operator<<(std::ostream &out, Expr const *obj)
    {
        out << obj->toString();
        return out;
    }